

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O1

QCborValueRef __thiscall QCborMap::operator[](QCborMap *this,QString *key)

{
  QStringView key_00;
  QCborValueConstRef QVar1;
  
  key_00.m_data = (key->d).ptr;
  key_00.m_size = (key->d).size;
  QVar1 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QStringView>((this->d).d.ptr,key_00);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->d,QVar1.d);
  return (QCborValueRef)QVar1;
}

Assistant:

QCborValueRef QCborMap::operator[](const QString & key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, qToStringViewIgnoringNull(key));
}